

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackframe.cpp
# Opt level: O3

void __thiscall
stackjit::StackWalker::visitReferences
          (StackWalker *this,StackFrame *stackFrame,VisitReferenceFn *fn,VisitFrameFn *frameFn)

{
  ExecutionEngine *pEVar1;
  CallStack *pCVar2;
  CallStackEntry *pCVar3;
  CallStackEntry *pCVar4;
  int iVar5;
  _Any_data *p_Var6;
  int iVar7;
  StackFrame callStackFrame;
  StackFrame local_88;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  if ((frameFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*frameFn->_M_invoker)((_Any_data *)frameFn,stackFrame);
  }
  p_Var6 = &local_70;
  std::function<void_(stackjit::StackFrameEntry)>::function
            ((function<void_(stackjit::StackFrameEntry)> *)&local_70,fn);
  visitReferencesInFrame((StackWalker *)p_Var6,stackFrame,(VisitReferenceFn *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  pEVar1 = VMState::engine(this->mVMState);
  pCVar2 = ExecutionEngine::callStack(pEVar1);
  pCVar3 = CallStack::top(pCVar2);
  pEVar1 = VMState::engine(this->mVMState);
  pCVar2 = ExecutionEngine::callStack(pEVar1);
  pCVar4 = CallStack::start(pCVar2);
  if (pCVar4 < pCVar3) {
    iVar7 = 1;
    do {
      local_88.mBasePtr = stackFrame->mBasePtr;
      iVar5 = iVar7;
      do {
        if (local_88.mBasePtr == (RegisterValue *)0x0) {
          local_88.mBasePtr = (RegisterValue *)0x0;
          break;
        }
        local_88.mBasePtr = (RegisterValue *)*local_88.mBasePtr;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      local_88.mFunction = pCVar3->function;
      local_88.mInstructionIndex = pCVar3->callPoint;
      if ((frameFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*frameFn->_M_invoker)((_Any_data *)frameFn,&local_88);
      }
      p_Var6 = &local_50;
      std::function<void_(stackjit::StackFrameEntry)>::function
                ((function<void_(stackjit::StackFrameEntry)> *)&local_50,fn);
      visitReferencesInFrame((StackWalker *)p_Var6,&local_88,(VisitReferenceFn *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      pCVar3 = pCVar3 + -1;
      pEVar1 = VMState::engine(this->mVMState);
      pCVar2 = ExecutionEngine::callStack(pEVar1);
      pCVar4 = CallStack::start(pCVar2);
      iVar7 = iVar7 + 1;
    } while (pCVar4 < pCVar3);
  }
  return;
}

Assistant:

void StackWalker::visitReferences(const StackFrame& stackFrame,	VisitReferenceFn fn, VisitFrameFn frameFn) {
		if (frameFn) {
			frameFn(stackFrame);
		}

		//Visit the calling stack frame
		visitReferencesInFrame(stackFrame, fn);

		//Then all other stack frames
		auto topEntryPtr = mVMState.engine().callStack().top();
		int topFuncIndex = 0;
		while (topEntryPtr > mVMState.engine().callStack().start()) {
			auto callEntry = *topEntryPtr;
			auto topFunc = callEntry.function;
			auto callPoint = callEntry.callPoint;
			auto callBasePtr = findBasePtr(stackFrame.basePtr(), 0, topFuncIndex);

			StackFrame callStackFrame(callBasePtr, topFunc, callPoint);
			if (frameFn) {
				frameFn(callStackFrame);
			}

			visitReferencesInFrame(callStackFrame, fn);

			topEntryPtr--;
			topFuncIndex++;
		}
	}